

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsingleshottimer.cpp
# Opt level: O3

void __thiscall QSingleShotTimer::timerEvent(QSingleShotTimer *this,QTimerEvent *event)

{
  quint16 *this_00;
  long lVar1;
  bool bVar2;
  qint64 qVar3;
  QThread *this_01;
  QObject *parent;
  Duration duration;
  
  if (event->m_id == Invalid) {
    event[1].super_QEvent._vptr_QEvent = (_func_int **)0x0;
    this_00 = &event[1].super_QEvent.t;
    bVar2 = QDeadlineTimer::hasExpired((QDeadlineTimer *)this_00);
    if (!bVar2) {
      lVar1._0_2_ = event[1].super_QEvent.t;
      lVar1._2_1_ = event[1].super_QEvent.m_posted;
      lVar1._3_1_ = event[1].super_QEvent.m_spont;
      lVar1._4_1_ = event[1].super_QEvent.m_accept;
      lVar1._5_1_ = event[1].super_QEvent.m_unused;
      lVar1._6_2_ = *(undefined2 *)&event[1].super_QEvent.field_0xe;
      duration.__r = 0x7fffffffffffffff;
      if (lVar1 != 0x7fffffffffffffff) {
        qVar3 = QDeadlineTimer::rawRemainingTimeNSecs((QDeadlineTimer *)this_00);
        duration.__r = 0;
        if (0 < qVar3) {
          duration.__r = qVar3;
        }
      }
      QBasicTimer::start((QBasicTimer *)(this + 0x10),duration,(uint)(byte)event[1].field_0x14,
                         (QObject *)this);
      this_01 = QThread::currentThread();
      parent = &QThread::eventDispatcher(this_01)->super_QObject;
      QObject::setParent((QObject *)this,parent);
      return;
    }
  }
  else {
    QBasicTimer::stop((QBasicTimer *)(this + 0x10));
  }
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)0x0);
  (**(code **)(*(long *)this + 0x20))(this);
  return;
}

Assistant:

void QSingleShotTimer::timerEvent(QTimerEvent *event)
{
    if (event->id() == Qt::TimerId::Invalid) {
        StartTimerEvent *startTimerEvent = static_cast<StartTimerEvent *>(event);
        Q_UNUSED(startTimerEvent->timer.release()); // it's the same as "this"
        const QDeadlineTimer &deadline = startTimerEvent->deadline;
        if (deadline.hasExpired()) {
            timerFinished();
        } else {
            timer.start(deadline.remainingTimeAsDuration(), deadline.timerType(), this);
            // we are now definitely in a thread that has an event dispatcher
            setParent(QThread::currentThread()->eventDispatcher());
        }
    } else {
        // need to kill the timer _before_ we emit timeout() in case the
        // slot connected to timeout calls processEvents()
        timer.stop();

        timerFinished();
    }
}